

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_facelift.c
# Opt level: O1

REF_STATUS
ref_facelift_edge_face_watertight
          (REF_FACELIFT ref_facelift,REF_INT edgeid,REF_INT faceid,REF_INT sense,REF_DBL t,
          REF_DBL *uv)

{
  REF_GEOM pRVar1;
  uint uVar2;
  undefined8 uVar3;
  char *pcVar4;
  REF_INT geom;
  REF_INT tri_cell;
  REF_INT edg_cell;
  REF_DBL edgexyz [3];
  REF_DBL facexyz [3];
  REF_DBL tri_bary [3];
  REF_DBL edg_bary [3];
  REF_INT nodes [27];
  int local_15c;
  REF_GEOM local_158;
  REF_DBL local_150;
  REF_INT local_148;
  REF_INT local_144;
  int local_140;
  int local_13c;
  double local_138;
  double local_130;
  double local_128;
  double local_120;
  double local_118;
  double local_110;
  double local_108;
  double local_100;
  REF_DBL local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  REF_DBL local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  double local_b8;
  undefined8 uStack_b0;
  REF_INT local_a8;
  REF_INT local_a4;
  REF_INT local_a0;
  
  local_150 = t;
  if (sense == 0) {
    pRVar1 = ref_facelift->grid->geom;
    uVar2 = ref_facelift_eval_at(ref_facelift,1,edgeid,&local_150,&local_138,(REF_DBL *)0x0);
    if (uVar2 == 0) {
      local_158 = pRVar1;
      uVar2 = ref_facelift_eval_at(ref_facelift,2,faceid,uv,&local_118,(REF_DBL *)0x0);
      if (uVar2 == 0) {
        local_120 = (local_108 - local_128) * (local_108 - local_128) +
                    (local_110 - local_130) * (local_110 - local_130) +
                    (local_118 - local_138) * (local_118 - local_138);
        if (local_120 < 0.0) {
          local_120 = sqrt(local_120);
        }
        else {
          local_120 = SQRT(local_120);
        }
        local_100 = local_150 * local_150 +
                    uv[1] * uv[1] +
                    *uv * *uv +
                    local_128 * local_128 + local_138 * local_138 + local_130 * local_130;
        if (local_100 < 0.0) {
          local_100 = sqrt(local_100);
        }
        else {
          local_100 = SQRT(local_100);
        }
        local_b8 = (double)(~-(ulong)(1.0 < local_100) & 0x3ddb7cdfd9d7bdbb |
                           (ulong)(local_100 * 1e-10) & -(ulong)(1.0 < local_100));
        uVar2 = 0;
        if (local_b8 < local_120) {
          uStack_b0 = 0;
          uVar2 = ref_facelift_enclosing(ref_facelift,1,edgeid,&local_150,&local_13c,&local_d8);
          if (uVar2 == 0) {
            if (local_13c == -1) {
              pcVar4 = "no enclosing found";
              uVar3 = 0x330;
            }
            else {
              local_144 = local_13c;
              uVar2 = ref_facelift_enclosing(ref_facelift,2,faceid,uv,&local_140,&local_f8);
              if (uVar2 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                       ,0x333,"ref_facelift_edge_face_watertight",(ulong)uVar2,"enclose");
                return uVar2;
              }
              if (local_140 == -1) {
                pcVar4 = "no enclosing found";
                uVar3 = 0x334;
              }
              else {
                local_148 = local_140;
                printf("edge %d t %f dist %e tol %e len %e\n",local_150,local_120,local_b8,local_100
                       ,(ulong)(uint)edgeid);
                printf("face %d uv %f %f\n",*uv,uv[1],(ulong)(uint)faceid);
                printf("edge xyz %e %e %e\n",local_138,local_130,local_128);
                printf("face xyz %e %e %e\n",local_118,local_110,local_108);
                printf("edg bary %f %f %f\n",local_d8,local_d0,local_c8);
                printf("tri bary %f %f %f\n",local_f8,local_f0,local_e8);
                uVar2 = ref_cell_nodes(ref_facelift->edg_cell,local_144,&local_a8);
                if (uVar2 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                         ,0x33f,"ref_facelift_edge_face_watertight",(ulong)uVar2,"nodes");
                  return uVar2;
                }
                uVar2 = ref_geom_find(local_158,local_a8,1,edgeid,&local_15c);
                pRVar1 = local_158;
                if (uVar2 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                         ,0x340,"ref_facelift_edge_face_watertight",(ulong)uVar2,"gm");
                  return uVar2;
                }
                printf("t0 %f\n",local_158->param[(long)local_15c * 2]);
                uVar2 = ref_geom_find(pRVar1,local_a4,1,edgeid,&local_15c);
                pRVar1 = local_158;
                if (uVar2 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                         ,0x342,"ref_facelift_edge_face_watertight",(ulong)uVar2,"gm");
                  return uVar2;
                }
                printf("t1 %f\n",local_158->param[(long)local_15c * 2]);
                uVar2 = ref_geom_find(pRVar1,local_a8,2,faceid,&local_15c);
                pRVar1 = local_158;
                if (uVar2 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                         ,0x345,"ref_facelift_edge_face_watertight",(ulong)uVar2,"gm");
                  return uVar2;
                }
                printf("uv0 %f %f along\n",local_158->param[(long)local_15c * 2],
                       local_158->param[local_15c * 2 + 1]);
                uVar2 = ref_geom_find(pRVar1,local_a4,2,faceid,&local_15c);
                if (uVar2 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                         ,0x348,"ref_facelift_edge_face_watertight",(ulong)uVar2,"gm");
                  return uVar2;
                }
                printf("uv1 %f %f along\n",local_158->param[(long)local_15c * 2],
                       local_158->param[local_15c * 2 + 1]);
                uVar2 = ref_cell_nodes(ref_facelift->tri_cell,local_148,&local_a8);
                if (uVar2 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                         ,0x34d,"ref_facelift_edge_face_watertight",(ulong)uVar2,"nodes");
                  return uVar2;
                }
                uVar2 = ref_geom_find(local_158,local_a8,2,faceid,&local_15c);
                pRVar1 = local_158;
                if (uVar2 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                         ,0x34e,"ref_facelift_edge_face_watertight",(ulong)uVar2,"gm");
                  return uVar2;
                }
                printf("uv0 %f %f\n",local_158->param[(long)local_15c * 2],
                       local_158->param[local_15c * 2 + 1]);
                uVar2 = ref_geom_find(pRVar1,local_a4,2,faceid,&local_15c);
                pRVar1 = local_158;
                if (uVar2 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                         ,0x351,"ref_facelift_edge_face_watertight",(ulong)uVar2,"gm");
                  return uVar2;
                }
                printf("uv1 %f %f\n",local_158->param[(long)local_15c * 2],
                       local_158->param[local_15c * 2 + 1]);
                uVar2 = ref_geom_find(pRVar1,local_a0,2,faceid,&local_15c);
                if (uVar2 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                         ,0x354,"ref_facelift_edge_face_watertight",(ulong)uVar2,"gm");
                  return uVar2;
                }
                printf("uv2 %f %f\n",local_158->param[(long)local_15c * 2],
                       local_158->param[local_15c * 2 + 1]);
                pcVar4 = "not watertight within tol";
                uVar3 = 0x358;
              }
            }
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                   ,uVar3,"ref_facelift_edge_face_watertight",pcVar4);
            uVar2 = 1;
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                   ,0x32f,"ref_facelift_edge_face_watertight",(ulong)uVar2,"enclose");
          }
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
               800,"ref_facelift_edge_face_watertight",(ulong)uVar2,"eval face");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x31d,"ref_facelift_edge_face_watertight",(ulong)uVar2,"eval edge");
    }
  }
  else {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
           0x319,"ref_facelift_edge_face_watertight","implement sense != 0 for uv jumps");
    uVar2 = 1;
  }
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_facelift_edge_face_watertight(REF_FACELIFT ref_facelift,
                                                     REF_INT edgeid,
                                                     REF_INT faceid,
                                                     REF_INT sense, REF_DBL t,
                                                     REF_DBL *uv) {
  REF_GEOM ref_geom = ref_facelift_geom(ref_facelift);
  REF_DBL edgexyz[3], facexyz[3], dist;
  REF_DBL len, tol;
  RAS(0 == sense, "implement sense != 0 for uv jumps");

  RSS(ref_facelift_eval_at(ref_facelift, REF_GEOM_EDGE, edgeid, &t, edgexyz,
                           NULL),
      "eval edge");
  RSS(ref_facelift_eval_at(ref_facelift, REF_GEOM_FACE, faceid, uv, facexyz,
                           NULL),
      "eval face");
  dist =
      sqrt(pow(facexyz[0] - edgexyz[0], 2) + pow(facexyz[1] - edgexyz[1], 2) +
           pow(facexyz[2] - edgexyz[2], 2));
  tol = 1.0e-10; /* increase tol if not O(1) */
  len = sqrt(ref_math_dot(edgexyz, edgexyz) + uv[0] * uv[0] + uv[1] * uv[1] +
             t * t);
  if (len > 1.0) tol = tol * len;
  if (dist > tol) {
    REF_INT edg_cell, tri_cell;
    REF_DBL edg_bary[3], tri_bary[3];
    REF_INT nodes[REF_CELL_MAX_SIZE_PER];
    REF_INT geom;
    RSS(ref_facelift_enclosing(ref_facelift, REF_GEOM_EDGE, edgeid, &t,
                               &edg_cell, edg_bary),
        "enclose");
    RUS(REF_EMPTY, edg_cell, "no enclosing found");
    RSS(ref_facelift_enclosing(ref_facelift, REF_GEOM_FACE, faceid, uv,
                               &tri_cell, tri_bary),
        "enclose");
    RUS(REF_EMPTY, tri_cell, "no enclosing found");

    printf("edge %d t %f dist %e tol %e len %e\n", edgeid, t, dist, tol, len);
    printf("face %d uv %f %f\n", faceid, uv[0], uv[1]);
    printf("edge xyz %e %e %e\n", edgexyz[0], edgexyz[1], edgexyz[2]);
    printf("face xyz %e %e %e\n", facexyz[0], facexyz[1], facexyz[2]);

    printf("edg bary %f %f %f\n", edg_bary[0], edg_bary[1], edg_bary[2]);
    printf("tri bary %f %f %f\n", tri_bary[0], tri_bary[1], tri_bary[2]);

    RSS(ref_cell_nodes(ref_facelift_edg(ref_facelift), edg_cell, nodes),
        "nodes");
    RSS(ref_geom_find(ref_geom, nodes[0], REF_GEOM_EDGE, edgeid, &geom), "gm");
    printf("t0 %f\n", ref_geom_param(ref_geom, 0, geom));
    RSS(ref_geom_find(ref_geom, nodes[1], REF_GEOM_EDGE, edgeid, &geom), "gm");
    printf("t1 %f\n", ref_geom_param(ref_geom, 0, geom));

    RSS(ref_geom_find(ref_geom, nodes[0], REF_GEOM_FACE, faceid, &geom), "gm");
    printf("uv0 %f %f along\n", ref_geom_param(ref_geom, 0, geom),
           ref_geom_param(ref_geom, 1, geom));
    RSS(ref_geom_find(ref_geom, nodes[1], REF_GEOM_FACE, faceid, &geom), "gm");
    printf("uv1 %f %f along\n", ref_geom_param(ref_geom, 0, geom),
           ref_geom_param(ref_geom, 1, geom));

    RSS(ref_cell_nodes(ref_facelift_tri(ref_facelift), tri_cell, nodes),
        "nodes");
    RSS(ref_geom_find(ref_geom, nodes[0], REF_GEOM_FACE, faceid, &geom), "gm");
    printf("uv0 %f %f\n", ref_geom_param(ref_geom, 0, geom),
           ref_geom_param(ref_geom, 1, geom));
    RSS(ref_geom_find(ref_geom, nodes[1], REF_GEOM_FACE, faceid, &geom), "gm");
    printf("uv1 %f %f\n", ref_geom_param(ref_geom, 0, geom),
           ref_geom_param(ref_geom, 1, geom));
    RSS(ref_geom_find(ref_geom, nodes[2], REF_GEOM_FACE, faceid, &geom), "gm");
    printf("uv2 %f %f\n", ref_geom_param(ref_geom, 0, geom),
           ref_geom_param(ref_geom, 1, geom));

    THROW("not watertight within tol");
  }
  return REF_SUCCESS;
}